

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void OpenSld(void)

{
  if (FP_SourceLevelDebugging == (FILE *)0x0) {
    OpenSld_buildDefaultNameIfNeeded();
    OpenSldImp((path *)Options::SourceLevelDebugFName_abi_cxx11_);
  }
  return;
}

Assistant:

void OpenSld() {
	// check if source-level-debug file is already opened
	if (nullptr != FP_SourceLevelDebugging) return;
	// build default filename if not explicitly provided, and default was requested
	OpenSld_buildDefaultNameIfNeeded();
	// try to open it if not opened yet
	OpenSldImp(Options::SourceLevelDebugFName);
}